

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  carrier_uint two_f;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  carrier_uint two_f_00;
  bool bVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  char cVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int in_ESI;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  decimal_fp<double> dVar22;
  cache_entry_type cache;
  uint128_wrapper *local_48 [2];
  ulong local_38;
  
  uVar18 = (ulong)x & 0xfffffffffffff;
  if (((ulong)x & 0x7ff0000000000000) != 0) {
    uVar21 = (uint)(((ulong)x & 0x7ff0000000000000) >> 0x34) - 0x433;
    if (uVar18 != 0) {
      uVar18 = uVar18 + 0x10000000000000;
      goto LAB_001ff42f;
    }
    uVar8 = (int)(uVar21 * 0x134413 + -0x7feff) >> 0x16;
    uVar20 = (ulong)uVar8;
    cVar12 = (char)((int)(uVar8 * -0x1a934f) >> 0x13) + (char)uVar21;
    cache_accessor<double>::get_cached_power((uint128_wrapper *)(ulong)-uVar8,in_ESI);
    bVar9 = 0xb - cVar12;
    uVar15 = (extraout_RDX_00 >> 0x35) + extraout_RDX_00 >> (bVar9 & 0x3f);
    uVar17 = (ulong)((uVar21 & 0xfffffffe) != 2) +
             (extraout_RDX_00 - (extraout_RDX_00 >> 0x36) >> (bVar9 & 0x3f));
    uVar18 = uVar15 / 10;
    if (uVar18 * 10 < uVar17) {
      uVar18 = (extraout_RDX_00 >> (10U - cVar12 & 0x3f)) + 1 >> 1;
      if (uVar21 == 0xffffffb3) {
        uVar18 = uVar18 & 0xfffffffffffffffe;
      }
      else {
        uVar18 = uVar18 + (uVar18 < uVar17);
      }
      goto LAB_001ff87b;
    }
    iVar10 = uVar8 + 1;
    uVar20 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
    uVar8 = (uint)uVar20;
    uVar21 = 0x10;
    if (uVar8 < 0x10) {
      uVar21 = uVar8;
    }
    if (uVar20 < 8) {
      if (uVar20 != 0) goto LAB_001ff7fc;
      goto LAB_001ff82d;
    }
    if (uVar18 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
      uVar16 = (uint)(uVar18 * -0x3898f8b4dd16f1df >> 8);
      uVar13 = 8;
      if (uVar8 != 8) {
        uVar8 = 9;
        if (9 < uVar21) {
          uVar8 = uVar21;
        }
        uVar21 = 8;
        do {
          uVar11 = uVar16 * -0x33333333;
          uVar13 = uVar21;
          if (0x33333333 < uVar11) break;
          uVar21 = uVar21 + 1;
          uVar16 = uVar11;
          uVar13 = uVar8;
        } while (uVar8 != uVar21);
      }
      goto LAB_001ff781;
    }
LAB_001ff7fc:
    uVar15 = uVar15 / 1000000000;
    iVar19 = (int)uVar15 * -100000000 + (int)uVar18;
    uVar21 = iVar19 * -0x33333333;
    if (0x33333333 < uVar21) goto LAB_001ff82d;
    if ((uVar8 != 1) && (uVar16 = iVar19 * -0x3d70a3d7, uVar16 < 0x33333334)) {
      if ((uVar8 != 2) && (uVar21 = iVar19 * 0x26e978d5, uVar21 < 0x33333334)) {
        if ((uVar8 != 3) && (uVar16 = iVar19 * 0x3afb7e91, uVar16 < 0x33333334)) {
          if ((uVar8 != 4) && (uVar21 = iVar19 * 0xbcbe61d, uVar21 < 0x33333334)) {
            if ((uVar8 != 5) && (uVar16 = iVar19 * 0x68c26139, uVar16 < 0x33333334)) {
              if ((uVar8 == 6) || (uVar21 = iVar19 * -0x5172b95b, 0x33333333 < uVar21)) {
                uVar15 = uVar15 & 0xffffffff;
                goto LAB_001ff9ef;
              }
              uVar15 = uVar15 & 0xffffffff;
              goto LAB_001ffa0e;
            }
            uVar15 = uVar15 & 0xffffffff;
            goto LAB_001ff9ac;
          }
          uVar15 = uVar15 & 0xffffffff;
          goto LAB_001ff961;
        }
        uVar15 = uVar15 & 0xffffffff;
        goto LAB_001ff916;
      }
      uVar15 = uVar15 & 0xffffffff;
      goto LAB_001ff8ce;
    }
    uVar15 = uVar15 & 0xffffffff;
LAB_001ff870:
    uVar18 = uVar15 * 10000000 + (ulong)(uVar21 >> 1);
    uVar13 = 1;
    goto LAB_001ff878;
  }
  uVar21 = 0xfffffbce;
  if (uVar18 == 0) {
    uVar20 = 0;
    uVar18 = 0;
    goto LAB_001ff87b;
  }
LAB_001ff42f:
  uVar8 = (int)(uVar21 * 0x134413) >> 0x16;
  uVar20 = (ulong)uVar8;
  iVar10 = uVar8 - 2;
  local_48[0] = cache_accessor<double>::get_cached_power
                          ((uint128_wrapper *)(ulong)(2 - uVar8),in_ESI);
  iVar19 = ((int)((2 - uVar8) * 0x1a934f) >> 0x13) + uVar21;
  two_f = uVar18 * 2 + 1;
  two_f_00 = uVar18 * 2;
  uVar18 = two_f << ((byte)iVar19 & 0x3f);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar18;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = extraout_RDX;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_48[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar18;
  uVar15 = SUB168(auVar1 * auVar5,8) +
           (ulong)CARRY8(SUB168(auVar2 * auVar6,8),SUB168(auVar1 * auVar5,0));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar15;
  uVar18 = SUB168(auVar3 * ZEXT816(0x83126e978d4fdf3c),8) >> 9;
  uVar13 = (int)uVar15 + (int)uVar18 * -1000;
  uVar16 = (uint)(extraout_RDX >> (~(byte)iVar19 & 0x3f));
  if (uVar16 < uVar13) {
LAB_001ff4ca:
    iVar14 = uVar13 - (uVar16 >> 1);
    uVar8 = iVar14 + 0x32;
    if ((uVar8 & 3) == 0) {
      uVar8 = (uVar8 >> 2) * 0xa429;
      uVar18 = uVar18 * 10 + (ulong)(uVar8 >> 0x14);
      if ((uVar8 & 0xff) < 0xb) {
        bVar7 = cache_accessor<double>::compute_mul_parity
                          (two_f_00,(cache_entry_type *)local_48,iVar19);
        if (bVar7 == (bool)((byte)iVar14 & 1)) {
          bVar7 = is_center_integer<double>(two_f_00,uVar21,iVar10);
          if (bVar7) {
            uVar18 = uVar18 & 0xfffffffffffffffe;
          }
        }
        else {
          uVar18 = uVar18 - 1;
        }
      }
    }
    else {
      if (1000 < uVar8) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x713,"n is too large");
      }
      uVar18 = uVar18 * 10 + (ulong)(uVar8 * 0xa3d8 >> 0x16);
    }
    goto LAB_001ff87b;
  }
  if (uVar13 < uVar16) {
    if (((((ulong)x & 1) != 0) && (uVar13 == 0)) &&
       (bVar7 = is_endpoint_integer<double>(two_f,uVar21,iVar10), bVar7)) {
      uVar18 = uVar18 - 1;
      uVar13 = 1000;
      goto LAB_001ff4ca;
    }
  }
  else if (((((ulong)x & 1) != 0) ||
           (local_38 = uVar18, bVar7 = is_endpoint_integer<double>(two_f_00 - 1,uVar21,iVar10),
           uVar18 = local_38, !bVar7)) &&
          (bVar7 = cache_accessor<double>::compute_mul_parity
                             (two_f_00 - 1,(cache_entry_type *)local_48,iVar19), !bVar7))
  goto LAB_001ff4ca;
  iVar10 = uVar8 + 1;
  uVar15 = 0;
  if (uVar18 != 0) {
    for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
    }
  }
  uVar8 = (uint)uVar15;
  uVar21 = 0x10;
  if (uVar8 < 0x10) {
    uVar21 = uVar8;
  }
  if (uVar15 < 8) {
    if (uVar15 != 0) goto LAB_001ff795;
LAB_001ff82d:
    uVar13 = 0;
  }
  else if (uVar18 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
    uVar16 = (uint)(uVar18 * -0x3898f8b4dd16f1df >> 8);
    uVar13 = 8;
    if (uVar8 != 8) {
      uVar8 = 9;
      if (9 < uVar21) {
        uVar8 = uVar21;
      }
      uVar21 = 8;
      do {
        uVar11 = uVar16 * -0x33333333;
        uVar13 = uVar21;
        if (0x33333333 < uVar11) break;
        uVar21 = uVar21 + 1;
        uVar16 = uVar11;
        uVar13 = uVar8;
      } while (uVar8 != uVar21);
    }
LAB_001ff781:
    uVar18 = (ulong)(uVar16 >> ((char)uVar13 - 8U & 0x1f));
  }
  else {
LAB_001ff795:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar18;
    uVar15 = SUB168(auVar4 * ZEXT816(0xabcc77118461d),8) >> 0xe;
    iVar19 = (int)uVar18 + (int)uVar15 * -100000000;
    uVar21 = iVar19 * -0x33333333;
    if (0x33333333 < uVar21) goto LAB_001ff82d;
    if ((uVar8 == 1) || (uVar16 = iVar19 * -0x3d70a3d7, 0x33333333 < uVar16)) goto LAB_001ff870;
    if ((uVar8 == 2) || (uVar21 = iVar19 * 0x26e978d5, 0x33333333 < uVar21)) {
LAB_001ff8ce:
      uVar18 = uVar15 * 1000000 + (ulong)(uVar16 >> 2);
      uVar13 = 2;
    }
    else if ((uVar8 == 3) || (uVar16 = iVar19 * 0x3afb7e91, 0x33333333 < uVar16)) {
LAB_001ff916:
      uVar18 = uVar15 * 100000 + (ulong)(uVar21 >> 3);
      uVar13 = 3;
    }
    else if ((uVar8 == 4) || (uVar21 = iVar19 * 0xbcbe61d, 0x33333333 < uVar21)) {
LAB_001ff961:
      uVar18 = uVar15 * 10000 + (ulong)(uVar16 >> 4);
      uVar13 = 4;
    }
    else if ((uVar8 == 5) || (uVar16 = iVar19 * 0x68c26139, 0x33333333 < uVar16)) {
LAB_001ff9ac:
      uVar18 = uVar15 * 1000 + (ulong)(uVar21 >> 5);
      uVar13 = 5;
    }
    else if ((uVar8 == 6) || (uVar21 = iVar19 * -0x5172b95b, 0x33333333 < uVar21)) {
LAB_001ff9ef:
      uVar18 = uVar15 * 100 + (ulong)(uVar16 >> 6);
      uVar13 = 6;
    }
    else {
LAB_001ffa0e:
      uVar18 = (ulong)(uVar21 >> 7) + uVar15 * 10;
      uVar13 = 7;
    }
  }
LAB_001ff878:
  uVar20 = (ulong)(iVar10 + uVar13);
LAB_001ff87b:
  dVar22._8_8_ = uVar20;
  dVar22.significand = uVar18;
  return dVar22;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}